

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O3

Rect __thiscall
SkylineBinPack::FindPositionForNewNodeBottomLeft
          (SkylineBinPack *this,int width,int height,int *bestHeight,int *bestWidth,int *bestIndex)

{
  int iVar1;
  bool bVar2;
  SkylineNode *pSVar3;
  ulong uVar4;
  long lVar5;
  Rect RVar6;
  Rect newNode;
  int y;
  Rect local_68;
  int local_4c;
  int *local_48;
  DisjointRectCollection *local_40;
  int *local_38;
  
  *bestHeight = 0x7fffffff;
  *bestIndex = -1;
  *bestWidth = 0x7fffffff;
  local_68.x = 0;
  local_68.y = 0;
  local_68.width = 0;
  local_68.height = 0;
  if ((this->skyLine).Count == 0) {
    local_68.width = 0;
    local_68.height = 0;
    local_68.x = 0;
    local_68.y = 0;
  }
  else {
    local_40 = &this->disjointRects;
    lVar5 = 8;
    uVar4 = 0;
    local_48 = bestWidth;
    local_38 = bestIndex;
    do {
      bVar2 = RectangleFits(this,(int)uVar4,width,height,&local_4c);
      if (bVar2) {
        iVar1 = local_4c + height;
        if (iVar1 < *bestHeight) {
          pSVar3 = (this->skyLine).Array;
        }
        else if ((iVar1 != *bestHeight) ||
                (pSVar3 = (this->skyLine).Array, *local_48 <= *(int *)((long)&pSVar3->x + lVar5)))
        goto LAB_00301e4b;
        *bestHeight = iVar1;
        *local_38 = (int)uVar4;
        *local_48 = *(int *)((long)&pSVar3->x + lVar5);
        local_68.y = local_4c;
        local_68.x = *(int *)((long)pSVar3 + lVar5 + -8);
        local_68.height = height;
        local_68.width = width;
        bVar2 = DisjointRectCollection::Disjoint(local_40,&local_68);
        if (!bVar2) {
          __assert_fail("disjointRects.Disjoint(newNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                        ,0x138,
                        "Rect SkylineBinPack::FindPositionForNewNodeBottomLeft(int, int, int &, int &, int &) const"
                       );
        }
      }
LAB_00301e4b:
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0xc;
    } while (uVar4 < (this->skyLine).Count);
  }
  RVar6.width = local_68.width;
  RVar6.height = local_68.height;
  RVar6.x = local_68.x;
  RVar6.y = local_68.y;
  return RVar6;
}

Assistant:

Rect SkylineBinPack::FindPositionForNewNodeBottomLeft(int width, int height, int &bestHeight, int &bestWidth, int &bestIndex) const
{
	bestHeight = INT_MAX;
	bestIndex = -1;
	// Used to break ties if there are nodes at the same level. Then pick the narrowest one.
	bestWidth = INT_MAX;
	Rect newNode = { 0, 0, 0, 0 };
	for(unsigned i = 0; i < skyLine.Size(); ++i)
	{
		int y;
		if (RectangleFits(i, width, height, y))
		{
			if (y + height < bestHeight || (y + height == bestHeight && skyLine[i].width < bestWidth))
			{
				bestHeight = y + height;
				bestIndex = i;
				bestWidth = skyLine[i].width;
				newNode.x = skyLine[i].x;
				newNode.y = y;
				newNode.width = width;
				newNode.height = height;
#ifdef _DEBUG
				assert(disjointRects.Disjoint(newNode));
#endif
			}
		}
/*		if (RectangleFits(i, height, width, y))
		{
			if (y + width < bestHeight || (y + width == bestHeight && skyLine[i].width < bestWidth))
			{
				bestHeight = y + width;
				bestIndex = i;
				bestWidth = skyLine[i].width;
				newNode.x = skyLine[i].x;
				newNode.y = y;
				newNode.width = height;
				newNode.height = width;
				assert(disjointRects.Disjoint(newNode));
			}
		}
*/	}

	return newNode;
}